

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown2Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  long lVar1;
  uint8_t *s;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1] = (uint8_t)((uint)src_ptr[lVar1 * 2 + src_stride] +
                           (uint)src_ptr[lVar1 * 2 + 1] + (uint)src_ptr[lVar1 * 2] +
                           (uint)src_ptr[lVar1 * 2 + src_stride + 1] + 2 >> 2);
    dst[lVar1 + 1] =
         (uint8_t)((uint)src_ptr[lVar1 * 2 + src_stride + 2] +
                   (uint)src_ptr[lVar1 * 2 + 3] + (uint)src_ptr[lVar1 * 2 + 2] +
                   (uint)src_ptr[lVar1 * 2 + src_stride + 3] + 2 >> 2);
  }
  if ((dst_width & 1U) != 0) {
    dst[lVar1] = (uint8_t)((uint)src_ptr[lVar1 * 2 + src_stride] +
                           (uint)src_ptr[lVar1 * 2 + 1] + (uint)src_ptr[lVar1 * 2] +
                           (uint)src_ptr[lVar1 * 2 + src_stride + 1] + 2 >> 2);
  }
  return;
}

Assistant:

void ScaleRowDown2Box_C(const uint8_t* src_ptr,
                        ptrdiff_t src_stride,
                        uint8_t* dst,
                        int dst_width) {
  const uint8_t* s = src_ptr;
  const uint8_t* t = src_ptr + src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
  }
}